

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::_::DebugComparison<unsigned_int,unsigned_int&>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<unsigned_int,_unsigned_int_&> *params)

{
  DebugComparison<unsigned_int,_unsigned_int_&> *this_00;
  DebugComparison<unsigned_int,_unsigned_int_&> *value;
  String local_30;
  kj *local_18;
  DebugComparison<unsigned_int,_unsigned_int_&> *params_local;
  
  local_18 = this;
  params_local = (DebugComparison<unsigned_int,_unsigned_int_&> *)__return_storage_ptr__;
  this_00 = fwd<kj::_::DebugComparison<unsigned_int,unsigned_int&>&>
                      ((DebugComparison<unsigned_int,_unsigned_int_&> *)this);
  toCharSequence<kj::_::DebugComparison<unsigned_int,unsigned_int&>&>(&local_30,(kj *)this_00,value)
  ;
  _::concat(__return_storage_ptr__,&local_30);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}